

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O2

void pnga_strided_acc(Integer g_a,Integer *lo,Integer *hi,Integer *skip,void *buf,Integer *ld,
                     void *alpha)

{
  short sVar1;
  Integer *lo_00;
  uint uVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  Integer IVar6;
  long ndim;
  long lVar7;
  char *dst_ptr;
  int proc;
  Integer *local_500;
  Integer *local_4f8;
  long local_4f0;
  long local_4e8;
  Integer *local_4e0;
  char *prem;
  Integer idx_buf;
  void *local_4c8;
  Integer *bhi;
  Integer *blo;
  Integer nstride;
  Integer plo [7];
  int count [14];
  Integer phi [7];
  int stride_loc [14];
  int stride_rem [14];
  Integer ldrem [7];
  _iterator_hdl it_hdl;
  
  local_4e8 = (long)GA[g_a + 1000].elemsize;
  sVar1 = GA[g_a + 1000].ndim;
  ndim = (long)sVar1;
  iVar3 = GA[g_a + 1000].type;
  local_500 = hi;
  local_4f8 = lo;
  local_4e0 = ld;
  local_4c8 = buf;
  pnga_nnodes();
  local_4f0 = (long)GA[g_a + 1000].p_handle;
  uVar2 = iVar3 - 0x3e9;
  if ((uVar2 < 7) && ((0x6fU >> (uVar2 & 0x1f) & 1) != 0)) {
    iVar3 = *(int *)(&DAT_001b32f0 + (ulong)uVar2 * 4);
  }
  else {
    pnga_error("nga_strided_acc: type not supported",(long)iVar3);
    iVar3 = -1;
  }
  lVar7 = 0;
  iVar4 = 0;
  if (0 < sVar1) {
    iVar4 = (int)sVar1;
  }
  for (; iVar4 != lVar7; lVar7 = lVar7 + 1) {
    if (skip[lVar7] < 1) {
      pnga_error("nga_strided_acc: Invalid value of skip along coordinate ",lVar7);
    }
  }
  gai_iterator_init(g_a,local_4f8,local_500,&it_hdl);
  local_500 = (Integer *)(local_4f0 * 0x28);
  while( true ) {
    iVar5 = gai_iterator_next(&it_hdl,&proc,&blo,&bhi,&prem,ldrem);
    lo_00 = blo;
    if (iVar5 == 0) break;
    for (lVar7 = 0; iVar4 != lVar7; lVar7 = lVar7 + 1) {
      plo[lVar7] = blo[lVar7];
      phi[lVar7] = bhi[lVar7];
    }
    IVar6 = gai_correct_strided_patch(ndim,local_4f8,skip,plo,phi);
    if (IVar6 != 0) {
      gai_FindOffset(ndim,lo_00,plo,ldrem,&idx_buf);
      lVar7 = local_4e8;
      dst_ptr = prem + idx_buf * local_4e8;
      prem = dst_ptr;
      gai_ComputePatchIndexWithSkip(ndim,local_4f8,plo,skip,local_4e0,&idx_buf);
      lVar7 = idx_buf * lVar7;
      iVar5 = gai_ComputeCountWithSkip(ndim,plo,phi,skip,count,&nstride);
      if (iVar5 != 0) {
        count[0] = count[0] * (int)local_4e8;
        gai_SetStrideWithSkip(ndim,local_4e8,local_4e0,ldrem,stride_rem,stride_loc,skip);
        if ((int)local_4f0 != -1) {
          proc = *(int *)(*(long *)((long)&PGRP_LIST->inv_map_proc_list + (long)local_500) +
                         (long)proc * 4);
        }
        ARMCI_AccS(iVar3,alpha,(void *)(lVar7 + (long)local_4c8),stride_loc,dst_ptr,stride_rem,count
                   ,(int)nstride + -1,proc);
      }
    }
  }
  gai_iterator_destroy(&it_hdl);
  return;
}

Assistant:

void pnga_strided_acc(Integer g_a, Integer *lo, Integer *hi, Integer *skip,
                      void *buf, Integer *ld, void *alpha)
{
  /* g_a:    Global Array handle
     lo[]:   Array of lower indices of patch of global array
     hi[]:   Array of upper indices of patch of global array
     skip[]: Array of skips for each dimension
     buf[]:  Local buffer that patch will be copied from
     ld[]:   ndim-1 physical dimensions of local buffer
     alpha:  muliplicative scale factor */
  Integer p, np=0, handle = GA_OFFSET + g_a;
  Integer idx, size, nstride, type, p_handle, nproc;
  int i, optype=-1, proc, ndim;
  Integer ldrem[MAXDIM];
  Integer idx_buf, *blo, *bhi;
  Integer plo[MAXDIM],phi[MAXDIM];
  char *pbuf, *prem;
  int count[2*MAXDIM], stride_rem[2*MAXDIM], stride_loc[2*MAXDIM];
  _iterator_hdl it_hdl;

  size = GA[handle].elemsize;
  ndim = GA[handle].ndim;
  type = GA[handle].type;
  nproc = pnga_nnodes();
  p_handle = GA[handle].p_handle;

  if (type == C_DBL) optype = ARMCI_ACC_DBL;
  else if (type == C_FLOAT) optype = ARMCI_ACC_FLT;
  else if (type == C_DCPL) optype = ARMCI_ACC_DCP;
  else if (type == C_SCPL) optype = ARMCI_ACC_CPL;
  else if (type == C_INT) optype = ARMCI_ACC_INT;
  else if (type == C_LONG) optype = ARMCI_ACC_LNG;
  else pnga_error("nga_strided_acc: type not supported",type);

  /* check values of skips to make sure they are legitimate */
  for (i = 0; i<ndim; i++) {
    if (skip[i]<1) {
      pnga_error("nga_strided_acc: Invalid value of skip along coordinate ",i);
    }
  }

  gai_iterator_init(g_a, lo, hi, &it_hdl);
  while (gai_iterator_next(&it_hdl, &proc, &blo, &bhi, &prem, ldrem)) {
      /* Correct ranges to account for skips in original patch. If no
         data is left in patch jump to next processor in loop. */
      for (i=0; i<ndim; i++) {
        plo[i] = blo[i];
        phi[i] = bhi[i];
      }
      if (!gai_correct_strided_patch((Integer)ndim, lo, skip, plo, phi))
        continue;
      /* May need to correct location of remote buffer */
      gai_FindOffset(ndim,blo,plo,ldrem,&idx_buf);
      prem += size*idx_buf;

      /* get pointer in local buffer to point indexed by plo given that
         the corner of the buffer corresponds to the point indexed by lo */
      gai_ComputePatchIndexWithSkip(ndim, lo, plo, skip, ld, &idx_buf);
      pbuf = size*idx_buf + (char*)buf;

      /* Compute number of elements in each stride region and compute the
         number of stride regions. Store the results in count and nstride */
      if (!gai_ComputeCountWithSkip(ndim, plo, phi, skip, count, &nstride))
        continue;

      /* Scale first element in count by element size. The ARMCI_PutS routine
         uses this convention to figure out memory sizes. */
      count[0] *= size;

      /* Calculate strides in memory for remote processor indexed by proc and
         local buffer */ 
      gai_SetStrideWithSkip(ndim, size, ld, ldrem, stride_rem, stride_loc,
          skip);

      /* BJP */
      if (p_handle != -1) {
        proc = PGRP_LIST[p_handle].inv_map_proc_list[proc];
      }
      ARMCI_AccS(optype, alpha, pbuf, stride_loc, prem, stride_rem, count,
          nstride-1, proc);
  }
  gai_iterator_destroy(&it_hdl);
}